

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DictionaryFeatureType::clear_KeyType(DictionaryFeatureType *this)

{
  Int64FeatureType *this_00;
  StringFeatureType *this_01;
  KeyTypeCase KVar1;
  Arena *pAVar2;
  DictionaryFeatureType *this_local;
  
  KVar1 = KeyType_case(this);
  if (KVar1 != KEYTYPE_NOT_SET) {
    if (KVar1 == kInt64KeyType) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_00 = (this->KeyType_).int64keytype_, this_00 != (Int64FeatureType *)0x0)) {
        Int64FeatureType::~Int64FeatureType(this_00);
        operator_delete(this_00,0x18);
      }
    }
    else if (((KVar1 == kStringKeyType) &&
             (pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation
                                 (&this->super_MessageLite), pAVar2 == (Arena *)0x0)) &&
            (this_01 = (this->KeyType_).stringkeytype_, this_01 != (StringFeatureType *)0x0)) {
      StringFeatureType::~StringFeatureType(this_01);
      operator_delete(this_01,0x18);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void DictionaryFeatureType::clear_KeyType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.DictionaryFeatureType)
  switch (KeyType_case()) {
    case kInt64KeyType: {
      if (GetArenaForAllocation() == nullptr) {
        delete KeyType_.int64keytype_;
      }
      break;
    }
    case kStringKeyType: {
      if (GetArenaForAllocation() == nullptr) {
        delete KeyType_.stringkeytype_;
      }
      break;
    }
    case KEYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = KEYTYPE_NOT_SET;
}